

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcStructuralAnalysisModel::IfcStructuralAnalysisModel
          (IfcStructuralAnalysisModel *this)

{
  *(undefined ***)&this->field_0x170 = &PTR__Object_007a99b0;
  *(undefined8 *)&this->field_0x178 = 0;
  *(char **)&this->field_0x180 = "IfcStructuralAnalysisModel";
  IfcSystem::IfcSystem(&this->super_IfcSystem,&PTR_construction_vtable_24__008668d0);
  *(undefined8 *)&(this->super_IfcSystem).field_0xf8 = 0;
  *(undefined8 *)&(this->super_IfcSystem).super_IfcGroup.super_IfcObject = 0x8667c8;
  *(undefined8 *)&this->field_0x170 = 0x8668b8;
  *(undefined8 *)&(this->super_IfcSystem).super_IfcGroup.super_IfcObject.field_0x88 = 0x8667f0;
  (this->super_IfcSystem).super_IfcGroup.super_IfcObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>._vptr_ObjectHelper =
       (_func_int **)0x866818;
  *(undefined8 *)&(this->super_IfcSystem).super_IfcGroup.super_IfcObject.field_0xd0 = 0x866840;
  *(undefined8 *)&(this->super_IfcSystem).super_IfcGroup.super_IfcObject.field_0xe0 = 0x866868;
  *(undefined8 *)&(this->super_IfcSystem).super_IfcGroup.field_0xf0 = 0x866890;
  *(undefined1 **)&(this->super_IfcSystem).field_0x100 = &this->field_0x110;
  *(undefined8 *)&this->field_0x108 = 0;
  this->field_0x110 = 0;
  (this->OrientationOf2DPlane).ptr.obj = (LazyObject *)0x0;
  (this->OrientationOf2DPlane).have = false;
  (this->LoadedBy).ptr.
  super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcStructuralLoadGroup>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcStructuralLoadGroup>_>_>
  .
  super__Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcStructuralLoadGroup>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcStructuralLoadGroup>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->LoadedBy).ptr.
  super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcStructuralLoadGroup>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcStructuralLoadGroup>_>_>
  .
  super__Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcStructuralLoadGroup>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcStructuralLoadGroup>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->LoadedBy).ptr.
           super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcStructuralLoadGroup>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcStructuralLoadGroup>_>_>
           .
           super__Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcStructuralLoadGroup>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcStructuralLoadGroup>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + 1) = 0;
  *(undefined8 *)
   ((long)&(this->LoadedBy).ptr.
           super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcStructuralLoadGroup>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcStructuralLoadGroup>_>_>
           .
           super__Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcStructuralLoadGroup>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcStructuralLoadGroup>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 1) = 0;
  (this->HasResults).ptr.
  super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcStructuralResultGroup>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcStructuralResultGroup>_>_>
  .
  super__Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcStructuralResultGroup>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcStructuralResultGroup>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->HasResults).ptr.
  super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcStructuralResultGroup>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcStructuralResultGroup>_>_>
  .
  super__Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcStructuralResultGroup>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcStructuralResultGroup>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->HasResults).ptr.
           super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcStructuralResultGroup>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcStructuralResultGroup>_>_>
           .
           super__Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcStructuralResultGroup>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcStructuralResultGroup>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + 1) = 0;
  *(undefined8 *)
   ((long)&(this->HasResults).ptr.
           super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcStructuralResultGroup>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcStructuralResultGroup>_>_>
           .
           super__Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcStructuralResultGroup>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcStructuralResultGroup>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 1) = 0;
  return;
}

Assistant:

IfcStructuralAnalysisModel() : Object("IfcStructuralAnalysisModel") {}